

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_iterator.hpp
# Opt level: O1

bool __thiscall
burst::
union_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_iterator<char>_>_>_>_>,_std::greater<void>_>
::equal(union_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_iterator<char>_>_>_>_>,_std::greater<void>_>
        *this,union_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_iterator<char>_>_>_>_>,_std::greater<void>_>
              *that)

{
  _List_node_base *p_Var1;
  iterator_range<std::_List_iterator<char>_> *piVar2;
  _List_node_base *p_Var3;
  iterator_range<std::_List_iterator<char>_> *piVar4;
  iterator_range<std::_List_iterator<char>_> *piVar5;
  _List_node_base *p_Var6;
  bool bVar7;
  
  piVar5 = (this->m_begin)._M_current;
  piVar4 = (that->m_begin)._M_current;
  if (piVar5 != piVar4) {
    __assert_fail("this->m_begin == that.m_begin",
                  "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/union_iterator.hpp"
                  ,0xa5,
                  "bool burst::union_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>> *, std::vector<boost::iterator_range<std::_List_iterator<char>>>>, std::greater<void>>::equal(const union_iterator<RandomAccessIterator, Compare> &) const [RandomAccessIterator = __gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>> *, std::vector<boost::iterator_range<std::_List_iterator<char>>>>, Compare = std::greater<void>]"
                 );
  }
  piVar2 = (this->m_end)._M_current;
  if ((long)piVar2 - (long)piVar5 != (long)(that->m_end)._M_current - (long)piVar4) {
    return false;
  }
  do {
    bVar7 = piVar5 == piVar2;
    if (bVar7) {
      return bVar7;
    }
    p_Var3 = (piVar4->
             super_iterator_range_base<std::_List_iterator<char>,_boost::iterators::bidirectional_traversal_tag>
             ).
             super_iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
             .m_Begin._M_node;
    p_Var1 = (piVar4->
             super_iterator_range_base<std::_List_iterator<char>,_boost::iterators::bidirectional_traversal_tag>
             ).
             super_iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
             .m_End._M_node;
    for (p_Var6 = (piVar5->
                  super_iterator_range_base<std::_List_iterator<char>,_boost::iterators::bidirectional_traversal_tag>
                  ).
                  super_iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
                  .m_Begin._M_node;
        p_Var6 != (piVar5->
                  super_iterator_range_base<std::_List_iterator<char>,_boost::iterators::bidirectional_traversal_tag>
                  ).
                  super_iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
                  .m_End._M_node; p_Var6 = p_Var6->_M_next) {
      if (p_Var3 == p_Var1) {
        return bVar7;
      }
      if (*(char *)&p_Var6[1]._M_next != *(char *)&p_Var3[1]._M_next) {
        return bVar7;
      }
      p_Var3 = p_Var3->_M_next;
    }
    if (p_Var3 != p_Var1) {
      return bVar7;
    }
    piVar5 = piVar5 + 1;
    piVar4 = piVar4 + 1;
  } while( true );
}

Assistant:

bool equal (const union_iterator & that) const
        {
            assert(this->m_begin == that.m_begin);
            return std::equal(this->m_begin, this->m_end, that.m_begin, that.m_end);
        }